

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O0

bool mg::data::mzx_decompress(string *compressed,string *out,bool invert)

{
  byte bVar1;
  size_type sVar2;
  byte bVar3;
  ulong uVar4;
  MzxHeader *pMVar5;
  byte *pbVar6;
  undefined1 *puVar7;
  byte bVar8;
  uint local_10c;
  uint8_t r1;
  uint8_t r0;
  uint i_2;
  size_type lookback_offset;
  uint i_1;
  int lookback_distance;
  uint i;
  anon_class_16_2_ffd38d68 emit_byte;
  uint len;
  uint cmd;
  uint8_t len_cmd;
  undefined8 uStack_d0;
  uint ring_buffer_write_offset;
  size_type decompress_offset;
  size_type read_offset;
  undefined2 local_b8 [2];
  int clear_count;
  uint16_t ring_buffer [64];
  undefined2 local_2b;
  uint8_t auStack_29 [4];
  uint8_t last [2];
  MzxHeader header;
  bool invert_local;
  string *out_local;
  string *compressed_local;
  
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 8) {
    fprintf(_stderr,"Header too small\n");
    compressed_local._7_1_ = false;
  }
  else {
    pMVar5 = (MzxHeader *)std::__cxx11::string::data();
    _auStack_29 = *pMVar5;
    MzxHeader::to_host_order((MzxHeader *)&stack0xffffffffffffffd7);
    if (auStack_29 == (uint8_t  [4])0x30585a4d) {
      std::__cxx11::string::resize((ulong)out);
      bVar3 = 0;
      if (invert) {
        bVar3 = 0xff;
      }
      memset(&local_2b,(uint)bVar3,2);
      bVar3 = 0;
      if (invert) {
        bVar3 = 0xff;
      }
      memset(local_b8,(uint)bVar3,0x80);
      read_offset._4_4_ = 0;
      decompress_offset = 8;
      uStack_d0 = 0;
      cmd = 0;
      while (sVar2 = decompress_offset, uVar4 = std::__cxx11::string::size(), sVar2 < uVar4) {
        decompress_offset = decompress_offset + 1;
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)compressed);
        emit_byte.out._4_4_ = *pbVar6 & 3;
        emit_byte.out._0_4_ = (int)(uint)*pbVar6 >> 2;
        if (read_offset._4_4_ < 1) {
          read_offset._4_4_ = 0x1000;
          bVar3 = 0;
          if (invert) {
            bVar3 = 0xff;
          }
          memset(&local_2b,(uint)bVar3,2);
        }
        _lookback_distance = &stack0xffffffffffffff30;
        emit_byte.decompress_offset = (size_type *)out;
        switch(emit_byte.out._4_4_) {
        case 0:
          for (i_1 = 0; i_1 <= (uint)emit_byte.out; i_1 = i_1 + 1) {
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,(uint8_t)local_2b);
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,local_2b._1_1_);
          }
          break;
        case 1:
          decompress_offset = decompress_offset + 1;
          std::__cxx11::string::operator[]((ulong)compressed);
          for (lookback_offset._4_4_ = 0; lookback_offset._4_4_ <= (uint)emit_byte.out;
              lookback_offset._4_4_ = lookback_offset._4_4_ + 1) {
            puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)out);
            local_2b = CONCAT11(local_2b._1_1_,*puVar7);
            puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)out);
            local_2b = CONCAT11(*puVar7,(uint8_t)local_2b);
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,(uint8_t)local_2b);
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,local_2b._1_1_);
          }
          break;
        case 2:
          local_2b = local_b8[(uint)emit_byte.out];
          mzx_decompress::anon_class_16_2_ffd38d68::operator()
                    ((anon_class_16_2_ffd38d68 *)&lookback_distance,(uint8_t)local_2b);
          mzx_decompress::anon_class_16_2_ffd38d68::operator()
                    ((anon_class_16_2_ffd38d68 *)&lookback_distance,local_2b._1_1_);
          break;
        case 3:
          for (local_10c = 0; local_10c <= (uint)emit_byte.out; local_10c = local_10c + 1) {
            decompress_offset = decompress_offset + 1;
            pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)compressed);
            bVar3 = 0;
            if (invert) {
              bVar3 = 0xff;
            }
            bVar3 = *pbVar6 ^ bVar3;
            decompress_offset = decompress_offset + 1;
            pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)compressed);
            bVar1 = *pbVar6;
            bVar8 = 0;
            if (invert) {
              bVar8 = 0xff;
            }
            local_2b = CONCAT11(bVar1 ^ bVar8,bVar3);
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,bVar3);
            mzx_decompress::anon_class_16_2_ffd38d68::operator()
                      ((anon_class_16_2_ffd38d68 *)&lookback_distance,local_2b._1_1_);
            local_b8[cmd] = CONCAT11(bVar1 ^ bVar8,bVar3);
            cmd = cmd + 1 & 0x3f;
          }
        }
      }
      compressed_local._7_1_ = true;
    }
    else {
      fprintf(_stderr,"Invalid file magic\n");
      compressed_local._7_1_ = false;
    }
  }
  return compressed_local._7_1_;
}

Assistant:

bool mzx_decompress(const std::string &compressed, std::string &out,
                    bool invert) {
  // If header is too small, bail immediately
  if (compressed.size() < sizeof(MzxHeader)) {
    fprintf(stderr, "Header too small\n");
    return false;
  }

  // Pun start of data stream into header
  MzxHeader header = *reinterpret_cast<const MzxHeader *>(compressed.data());
  header.to_host_order();

  // If the magic doesn't match, do not try and uncompress
  if (memcmp(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic)) != 0) {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }

  // Resize output buffer to accomodate decompressed data
  out.resize(header.decompressed_size);

  // Last written short
  uint8_t last[2];
  memset(last, invert ? 0xFF : 0x00, sizeof(last));

  // Ring buffer
  uint16_t ring_buffer[64];
  memset(ring_buffer, invert ? 0xFF : 0x00, sizeof(ring_buffer));

  // Clear counter. Last data is reinitialized on zero.
  int clear_count = 0;

  // Start reading right after the header
  std::string::size_type read_offset = sizeof(MzxHeader);
  std::string::size_type decompress_offset = 0;
  unsigned ring_buffer_write_offset = 0;
  while (read_offset < compressed.size()) {
    // Get type / len
    const uint8_t len_cmd = compressed[read_offset++];
    const unsigned cmd = len_cmd & 0b11;
    const unsigned len = len_cmd >> 2;

    // Reset counter
    if (clear_count <= 0) {
      clear_count = 0x1000;
      memset(last, invert ? 0xFF : 0x00, sizeof(last));
    }

    auto emit_byte = [&](uint8_t byte) {
      if (decompress_offset >= out.size()) {
        // fprintf(stderr, "Tried to write %d bytes past end of buffer: %02x\n",
        //         (int)decompress_offset - (int)out.size(), byte);
        return;
      }
      out[decompress_offset++] = byte;
    };

    switch (cmd) {

    case CMD_RLE: {
      // Repeat last two bytes len + 1 times
      for (unsigned i = 0; i <= len; i++) {
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_BACKREF: {
      const int lookback_distance =
          2 * (static_cast<uint8_t>(compressed[read_offset++]) + 1);
      for (unsigned i = 0; i <= len; i++) {
        const std::string::size_type lookback_offset =
            decompress_offset - lookback_distance;

        // Read 2 bytes into last buffer
        last[0] = out[lookback_offset];
        last[1] = out[lookback_offset + 1];

        // Write those bytes to end of stream
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_RINGBUF: {
      // Load ring buffer data at position len into last
      *reinterpret_cast<uint16_t *>(last) = ring_buffer[len];

      // Emit last
      emit_byte(last[0]);
      emit_byte(last[1]);
    } break;

    case CMD_LITERAL: {
      for (unsigned i = 0; i <= len; i++) {
        const uint8_t r0 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);
        const uint8_t r1 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);

        // Update last
        last[0] = r0;
        last[1] = r1;

        // Emit data
        emit_byte(last[0]);
        emit_byte(last[1]);

        // Write to ring buffer
        ring_buffer[ring_buffer_write_offset++] = (r1 << 8) | r0;
        ring_buffer_write_offset &= 0x3f;
      }
      break;
    }
    }
  }

  return true;
}